

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3ExprAnalyzeAggregates(NameContext *pNC,Expr *pExpr)

{
  undefined1 local_48 [8];
  Walker w;
  Expr *pExpr_local;
  NameContext *pNC_local;
  
  w.pParse = (Parse *)analyzeAggregate;
  w.xExprCallback = sqlite3WalkerDepthIncrease;
  w.xSelectCallback = sqlite3WalkerDepthDecrease;
  w.xSelectCallback2._0_4_ = 0;
  local_48 = (undefined1  [8])0x0;
  w._32_8_ = pNC;
  w.u = (anon_union_8_17_dfc45e9e_for_u)pExpr;
  sqlite3WalkExpr((Walker *)local_48,pExpr);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprAnalyzeAggregates(NameContext *pNC, Expr *pExpr){
  Walker w;
  w.xExprCallback = analyzeAggregate;
  w.xSelectCallback = sqlite3WalkerDepthIncrease;
  w.xSelectCallback2 = sqlite3WalkerDepthDecrease;
  w.walkerDepth = 0;
  w.u.pNC = pNC;
  w.pParse = 0;
  assert( pNC->pSrcList!=0 );
  sqlite3WalkExpr(&w, pExpr);
}